

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::AlignTextToFramePadding(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  
  pIVar5 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    fVar1 = (pIVar5->Style).FramePadding.y;
    fVar2 = (pIVar4->DC).CurrLineTextBaseOffset;
    uVar6 = -(uint)(fVar1 <= fVar2);
    fVar8 = fVar1 + fVar1 + pIVar5->FontSize;
    fVar3 = (pIVar4->DC).CurrLineSize.y;
    uVar7 = -(uint)(fVar8 <= fVar3);
    (pIVar4->DC).CurrLineSize.y = (float)(uVar7 & (uint)fVar3 | ~uVar7 & (uint)fVar8);
    (pIVar4->DC).CurrLineTextBaseOffset = (float)(~uVar6 & (uint)fVar1 | (uint)fVar2 & uVar6);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }